

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O1

QPDFObjectHandle __thiscall QPDFParser::withDescription<QPDF_Bool,bool>(QPDFParser *this,bool *args)

{
  char cVar1;
  size_type sVar2;
  string *this_00;
  char *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar3;
  
  cVar1 = *in_RDX;
  this_00 = (string *)operator_new(0x70);
  this_00->_M_string_length = 0x100000001;
  (this_00->_M_dataplus)._M_p = (pointer)&PTR___Sp_counted_ptr_inplace_002eeae8;
  (this_00->field_2)._M_local_buf[0] = cVar1;
  *(undefined1 *)&this_00[2]._M_dataplus._M_p = 3;
  this_00[2]._M_string_length = 0;
  this_00[2].field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&this_00[2].field_2 + 8) = 0;
  this_00[3]._M_dataplus._M_p = (pointer)0x0;
  this_00[3]._M_string_length = 0xffffffffffffffff;
  sVar2 = *(size_type *)(args + 0x78);
  *(undefined8 *)((long)&this_00[2].field_2 + 8) = *(undefined8 *)(args + 0x20);
  this_00[2]._M_string_length = *(size_type *)(args + 0x28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this_00[2].field_2._M_allocated_capacity
             ,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(args + 0x30));
  if ((long)this_00[3]._M_string_length < 0) {
    this_00[3]._M_string_length = sVar2;
  }
  this->input = (InputSource *)&this_00->field_2;
  this->object_description = this_00;
  if (__libc_single_threaded == '\0') {
    LOCK();
    *(int *)&this_00->_M_string_length = (int)this_00->_M_string_length + 1;
    UNLOCK();
  }
  else {
    *(int *)&this_00->_M_string_length = (int)this_00->_M_string_length + 1;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFParser::withDescription(Args&&... args)
{
    auto obj = QPDFObject::create<T>(std::forward<Args>(args)...);
    obj->setDescription(context, description, start);
    return {obj};
}